

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O3

void __thiscall cmCommonTargetGenerator::~cmCommonTargetGenerator(cmCommonTargetGenerator *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

cmCommonTargetGenerator::~cmCommonTargetGenerator()
{
}